

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean artifact_hit_drainlife
                  (monst *magr,monst *mdef,obj *otmp,obj *ostack,obj *olaunch,int *dmgptr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  int oldhpmax;
  int drain;
  boolean vis;
  boolean youdefend;
  boolean youattack;
  int *dmgptr_local;
  obj *olaunch_local;
  obj *ostack_local;
  obj *otmp_local;
  monst *mdef_local;
  monst *magr_local;
  
  iVar1 = u.uhpmax;
  if ((((magr == &youmonst) || (magr == (monst *)0x0)) ||
      (local_4d = 1, (viz_array[magr->my][magr->mx] & 2U) == 0)) &&
     ((mdef == &youmonst || (local_4d = 1, (viz_array[mdef->my][mdef->mx] & 2U) == 0)))) {
    local_4e = 0;
    if ((magr == &youmonst) &&
       ((local_4e = 0, (u._1052_1_ & 1) != 0 && (local_4e = 0, mdef == u.ustuck)))) {
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (local_4f = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        local_50 = false;
        if (ublindf != (obj *)0x0) {
          local_50 = ublindf->oartifact == '\x1d';
        }
        local_4f = local_50 ^ 0xff;
      }
      local_4e = local_4f ^ 0xff;
    }
    local_4d = local_4e;
  }
  magr_local._7_1_ = local_4d & 1;
  if (mdef == &youmonst) {
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if (otmp->oartifact == '\x03') {
        pcVar2 = hcolor("black");
        pline("The %s blade drains your life!",pcVar2);
      }
      else {
        pcVar2 = distant_name(otmp,xname);
        pcVar2 = The(pcVar2);
        pline("%s drains your life!",pcVar2);
        oprop_id(4,otmp,ostack,olaunch);
      }
    }
    else {
      pcVar2 = "object";
      if (otmp->oartifact == '\x03') {
        pcVar2 = "unholy blade";
      }
      pline("You feel an %s drain your life!",pcVar2);
    }
    losexp("life drainage");
    if (((magr != (monst *)0x0) && (magr->mhp < magr->mhpmax)) &&
       (magr->mhp = (iVar1 - u.uhpmax) / 2 + magr->mhp, magr->mhpmax < magr->mhp)) {
      magr->mhp = magr->mhpmax;
    }
    magr_local._7_1_ = 1;
  }
  else {
    if (magr_local._7_1_ != 0) {
      if (otmp->oartifact == '\x03') {
        pcVar2 = hcolor("black");
        pcVar3 = mon_nam(mdef);
        pline("The %s blade draws the life from %s!",pcVar2,pcVar3);
      }
      else {
        pcVar2 = distant_name(otmp,xname);
        pcVar2 = The(pcVar2);
        pcVar3 = mon_nam(mdef);
        pline("%s draws the life from %s!",pcVar2,pcVar3);
        oprop_id(4,otmp,ostack,olaunch);
      }
    }
    if (mdef->m_lev == '\0') {
      *dmgptr = mdef->mhp * 2 + 200;
    }
    else {
      iVar1 = rnd(8);
      *dmgptr = iVar1 + *dmgptr;
      mdef->mhpmax = mdef->mhpmax - iVar1;
      mdef->m_lev = mdef->m_lev + 0xff;
      if (iVar1 / 2 != 0) {
        healup(iVar1 / 2,0,'\0','\0');
      }
    }
  }
  return magr_local._7_1_;
}

Assistant:

static boolean artifact_hit_drainlife(struct monst *magr, struct monst *mdef,
				      struct obj *otmp, struct obj *ostack,
				      struct obj *olaunch,
				      int *dmgptr)
{
    boolean youattack = (magr == &youmonst);
    boolean youdefend = (mdef == &youmonst);
    boolean vis = (!youattack && magr && cansee(magr->mx, magr->my))
	|| (!youdefend && cansee(mdef->mx, mdef->my))
	|| (youattack && u.uswallow && mdef == u.ustuck && !Blind);

    if (!youdefend) {
	    if (vis) {
		if (otmp->oartifact == ART_STORMBRINGER) {
		    pline("The %s blade draws the life from %s!",
			    hcolor("black"),
			    mon_nam(mdef));
		} else {
		    pline("%s draws the life from %s!",
			    The(distant_name(otmp, xname)),
			    mon_nam(mdef));
		    oprop_id(ITEM_DRLI, otmp, ostack, olaunch);
		}
	    }
	    if (mdef->m_lev == 0) {
		*dmgptr = 2 * mdef->mhp + FATAL_DAMAGE_MODIFIER;
	    } else {
		int drain = rnd(8);
		*dmgptr += drain;
		mdef->mhpmax -= drain;
		mdef->m_lev--;
		drain /= 2;
		if (drain) healup(drain, 0, FALSE, FALSE);
	    }
	    return vis;
    } else { /* youdefend */
	    int oldhpmax = u.uhpmax;

	    if (Blind) {
		    pline("You feel an %s drain your life!",
			otmp->oartifact == ART_STORMBRINGER ?
			"unholy blade" : "object");
	    } else if (otmp->oartifact == ART_STORMBRINGER) {
		    pline("The %s blade drains your life!",
			    hcolor("black"));
	    } else {
		    pline("%s drains your life!",
			    The(distant_name(otmp, xname)));
		    oprop_id(ITEM_DRLI, otmp, ostack, olaunch);
	    }
	    losexp("life drainage");
	    if (magr && magr->mhp < magr->mhpmax) {
		magr->mhp += (oldhpmax - u.uhpmax)/2;
		if (magr->mhp > magr->mhpmax) magr->mhp = magr->mhpmax;
	    }
	    return TRUE;
    }
    return FALSE;
}